

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::UnionUnPackSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def,bool inclass)

{
  undefined3 in_register_00000009;
  char *__lhs;
  allocator<char> local_129;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"void *",&local_129);
  __lhs = "";
  if (CONCAT31(in_register_00000009,inclass) != 0) {
    __lhs = "static ";
  }
  std::operator+(&local_c8,__lhs,&local_48);
  if (inclass) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"",(allocator<char> *)&local_128);
  }
  else {
    EscapeKeyword(&local_128,this,(string *)enum_def);
    std::operator+(&local_108,&local_128,"Union::");
  }
  std::operator+(&local_a8,&local_c8,&local_108);
  std::operator+(&local_88,&local_a8,"UnPack(const void *obj, ");
  EscapeKeyword(&local_e8,this,(string *)enum_def);
  std::operator+(&local_68,&local_88,&local_e8);
  std::operator+(__return_storage_ptr__,&local_68,
                 " type, const ::flatbuffers::resolver_function_t *resolver)");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_108);
  if (!inclass) {
    std::__cxx11::string::~string((string *)&local_128);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string UnionUnPackSignature(const EnumDef &enum_def, bool inclass) {
    return (inclass ? "static " : "") + std::string("void *") +
           (inclass ? "" : Name(enum_def) + "Union::") +
           "UnPack(const void *obj, " + Name(enum_def) +
           " type, const ::flatbuffers::resolver_function_t *resolver)";
  }